

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Sub *local_380;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  undefined1 local_321;
  anon_class_24_3_830bc230_for_cb local_320;
  allocator<char> local_301;
  string local_300;
  char *local_2e0;
  allocator<char> local_2d1;
  string local_2d0;
  char *local_2b0 [3];
  allocator<char> local_291;
  string local_290;
  Sub *local_270;
  Sub local_268;
  Sub local_1b0;
  Sub local_f8;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  undefined1 local_20 [8];
  Printer *printer_local;
  undefined8 uStack_10;
  RequestOrResponse which_local;
  ServiceGenerator *this_local;
  
  local_321 = 1;
  local_270 = &local_268;
  local_20 = (undefined1  [8])printer;
  printer_local._4_4_ = which;
  uStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"which",&local_291);
  local_2b0[0] = "FooResponse";
  if (printer_local._4_4_ == kRequest) {
    local_2b0[0] = "FooRequest";
  }
  local_2b0[0] = local_2b0[0] + 3;
  protobuf::io::Printer::Sub::Sub<char_const*>(&local_268,&local_290,local_2b0);
  local_270 = &local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"which_type",&local_2d1);
  local_2e0 = "output";
  if (printer_local._4_4_ == kRequest) {
    local_2e0 = "input";
  }
  protobuf::io::Printer::Sub::Sub<char_const*>(&local_1b0,&local_2d0,&local_2e0);
  local_270 = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"cases",&local_301);
  local_320.which = (RequestOrResponse *)((long)&printer_local + 4);
  local_320.printer = (Printer **)local_20;
  local_320.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype(google::protobuf::compiler::cpp::ServiceGenerator::RequestOrResponse,google::protobuf::io::Printer*)::__0>
            (&local_f8,&local_300,&local_320);
  local_321 = 0;
  local_40 = &local_268;
  local_38 = 3;
  v._M_len = 3;
  v._M_array = local_40;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_30._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_338,
             "\n        const $pb$::Message& $classname$::Get$which$Prototype(\n            const $pb$::MethodDescriptor* $nonnull$ method) const {\n          ABSL_DCHECK_EQ(method->service(), descriptor());\n          switch (method->index()) {\n            $cases$;\n\n            default:\n              ABSL_LOG(FATAL) << \"Bad method index; this should never happen.\";\n              return *$pb$::MessageFactory::generated_factory()->GetPrototype(\n                  method->$which_type$_type());\n          }\n        }\n      "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit
            (printer,local_30._M_allocated_capacity,local_30._8_8_,local_338._M_len,local_338._M_str
            );
  local_380 = (Sub *)&local_40;
  do {
    local_380 = local_380 + -1;
    protobuf::io::Printer::Sub::~Sub(local_380);
  } while (local_380 != &local_268);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  printer->Emit(
      {
          {"which", which == kRequest ? "Request" : "Response"},
          {"which_type", which == kRequest ? "input" : "output"},
          {"cases",
           [&] {
             for (int i = 0; i < descriptor_->method_count(); ++i) {
               const MethodDescriptor* method = descriptor_->method(i);
               const Descriptor* type = which == kRequest
                                            ? method->input_type()
                                            : method->output_type();

               printer->Emit(
                   {
                       {"index", absl::StrCat(i)},
                       {"type", QualifiedClassName(type, *options_)},
                   },
                   R"cc(
                     case $index$:
                       return $type$::default_instance();
                   )cc");
             }
           }},
      },
      R"cc(
        const $pb$::Message& $classname$::Get$which$Prototype(
            const $pb$::MethodDescriptor* $nonnull$ method) const {
          ABSL_DCHECK_EQ(method->service(), descriptor());
          switch (method->index()) {
            $cases$;

            default:
              ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
              return *$pb$::MessageFactory::generated_factory()->GetPrototype(
                  method->$which_type$_type());
          }
        }
      )cc");
}